

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_setup_encoder(opj_j2k_t *j2k,opj_cparameters_t *parameters,opj_image_t *image)

{
  opj_poc_t *poVar1;
  opj_poc_t *poVar2;
  int iVar3;
  uint uVar4;
  OPJ_CINEMA_MODE OVar5;
  int *__src;
  char *__s;
  opj_image_comp_t *poVar6;
  OPJ_PROG_ORDER OVar7;
  OPJ_UINT32 OVar8;
  int iVar9;
  opj_cp_t *poVar10;
  int *__dest;
  char *__dest_00;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  OPJ_UINT32 OVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  opj_tccp_t *tccp;
  OPJ_UINT32 OVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  opj_cparameters_t *poVar26;
  long lVar27;
  size_t sVar28;
  ulong uVar29;
  bool bVar30;
  long local_50;
  
  if (image != (opj_image_t *)0x0 &&
      (parameters != (opj_cparameters_t *)0x0 && j2k != (opj_j2k_t *)0x0)) {
    poVar10 = (opj_cp_t *)calloc(1,0x90);
    j2k->cp = poVar10;
    poVar10->tw = 1;
    poVar10->th = 1;
    iVar9 = parameters->max_comp_size;
    poVar10->cinema = parameters->cp_cinema;
    poVar10->max_comp_size = iVar9;
    poVar10->rsiz = parameters->cp_rsiz;
    iVar9 = parameters->cp_fixed_alloc;
    poVar10->disto_alloc = parameters->cp_disto_alloc;
    poVar10->fixed_alloc = iVar9;
    poVar10->fixed_quality = parameters->cp_fixed_quality;
    __src = parameters->cp_matrice;
    if (__src != (int *)0x0) {
      sVar28 = (long)(parameters->tcp_numlayers * parameters->numresolution * 3) << 2;
      __dest = (int *)malloc(sVar28);
      poVar10->matrice = __dest;
      memcpy(__dest,__src,sVar28);
    }
    iVar9 = parameters->cp_tdx;
    poVar10->tdx = iVar9;
    iVar3 = parameters->cp_tdy;
    poVar10->tdy = iVar3;
    uVar4 = parameters->cp_tx0;
    poVar10->tx0 = uVar4;
    uVar15 = parameters->cp_ty0;
    poVar10->ty0 = uVar15;
    __s = parameters->cp_comment;
    if (__s != (char *)0x0) {
      sVar28 = strlen(__s);
      __dest_00 = (char *)malloc(sVar28 + 1);
      poVar10->comment = __dest_00;
      if (__dest_00 != (char *)0x0) {
        strcpy(__dest_00,__s);
      }
    }
    if (parameters->tile_size_on == 0) {
      poVar10->tdx = image->x1 - uVar4;
      poVar10->tdy = image->y1 - uVar15;
    }
    else {
      poVar10->tw = (int)(image->x1 + iVar9 + ~uVar4) / iVar9;
      poVar10->th = (int)(~uVar15 + iVar3 + image->y1) / iVar3;
    }
    if (parameters->tp_on != '\0') {
      poVar10->tp_flag = parameters->tp_flag;
      poVar10->tp_on = '\x01';
    }
    poVar10->img_size = 0;
    if ((ulong)image->numcomps != 0) {
      poVar6 = image->comps;
      iVar9 = poVar10->img_size;
      lVar19 = 0;
      do {
        iVar9 = iVar9 + *(int *)((long)&poVar6->h + lVar19) * *(int *)((long)&poVar6->w + lVar19) *
                        *(int *)((long)&poVar6->prec + lVar19);
        lVar19 = lVar19 + 0x38;
      } while ((ulong)image->numcomps * 0x38 - lVar19 != 0);
      poVar10->img_size = iVar9;
    }
    poVar11 = (opj_tcp_t *)calloc((long)poVar10->th * (long)poVar10->tw,0x15e8);
    poVar10->tcps = poVar11;
    if (0 < poVar10->th * poVar10->tw) {
      local_50 = 0;
      uVar16 = 0;
      do {
        poVar11 = poVar10->tcps;
        lVar19 = (long)parameters->tcp_numlayers;
        poVar11[uVar16].numlayers = parameters->tcp_numlayers;
        if (0 < lVar19) {
          OVar5 = poVar10->cinema;
          iVar9 = poVar10->fixed_quality;
          lVar21 = 0x1450;
          if (iVar9 == 0) {
            lVar21 = 0x12c0;
          }
          lVar24 = 0x144c;
          if (iVar9 == 0) {
            lVar24 = 0x14;
          }
          lVar25 = (long)poVar11->rates + local_50 + -0x14;
          poVar26 = parameters;
          do {
            bVar30 = OVar5 == OFF;
            lVar27 = 0x12c0;
            if (bVar30) {
              lVar27 = lVar21;
            }
            lVar17 = 0x14;
            if (bVar30) {
              lVar17 = lVar24;
            }
            if (!bVar30 && iVar9 != 0) {
              *(float *)(lVar25 + 0x144c) = poVar26->tcp_distoratio[0];
              lVar17 = 0x14;
              lVar27 = 0x12c0;
            }
            *(undefined4 *)(lVar25 + lVar17) =
                 *(undefined4 *)(poVar26->POC[0].progorder + lVar27 + -0x60);
            poVar26 = (opj_cparameters_t *)&poVar26->cp_tx0;
            lVar25 = lVar25 + 4;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
        OVar7 = parameters->prog_order;
        poVar11[uVar16].csty = parameters->csty;
        poVar11[uVar16].prg = OVar7;
        poVar11[uVar16].mct = (int)parameters->tcp_mct;
        poVar11[uVar16].POC = 0;
        uVar4 = parameters->numpocs;
        if ((ulong)uVar4 == 0) {
          iVar9 = 0;
        }
        else {
          poVar11[uVar16].POC = 1;
          if ((int)uVar4 < 1) {
            iVar9 = -1;
          }
          else {
            lVar19 = 0;
            iVar9 = 0;
            do {
              iVar3 = *(int *)(parameters->POC[0].progorder + lVar19 + 8);
              if (iVar3 == -1 || uVar16 == iVar3 - 1) {
                poVar1 = parameters->POC + iVar9;
                OVar18 = poVar1->compno0;
                OVar22 = poVar1->layno1;
                OVar8 = poVar1->resno1;
                poVar2 = poVar11[uVar16].pocs + iVar9;
                poVar2->resno0 = poVar1->resno0;
                poVar2->compno0 = OVar18;
                poVar2->layno1 = OVar22;
                poVar2->resno1 = OVar8;
                poVar11[uVar16].pocs[iVar9].compno1 = parameters->POC[iVar9].compno1;
                poVar11[uVar16].pocs[iVar9].prg1 = parameters->POC[iVar9].prg1;
                poVar11[uVar16].pocs[iVar9].tile = parameters->POC[iVar9].tile;
                iVar9 = iVar9 + 1;
              }
              lVar19 = lVar19 + 0x94;
            } while ((ulong)uVar4 * 0x94 - lVar19 != 0);
            iVar9 = iVar9 + -1;
          }
        }
        poVar11[uVar16].numpocs = iVar9;
        uVar4 = image->numcomps;
        poVar12 = (opj_tccp_t *)calloc((ulong)uVar4,0x438);
        poVar11[uVar16].tccps = poVar12;
        if ((ulong)uVar4 != 0) {
          lVar21 = 0x3b0;
          lVar19 = 0;
          uVar29 = 0;
          do {
            poVar12 = poVar11[uVar16].tccps;
            uVar15 = parameters->csty & 1;
            poVar12[uVar29].csty = uVar15;
            uVar4 = parameters->numresolution;
            poVar12[uVar29].numresolutions = uVar4;
            OVar18 = 0;
            OVar22 = 0;
            if (1 < parameters->cblockw_init) {
              OVar22 = 0;
              uVar23 = parameters->cblockw_init;
              do {
                OVar22 = OVar22 + 1;
                bVar30 = 3 < uVar23;
                uVar23 = uVar23 >> 1;
              } while (bVar30);
            }
            tccp = poVar12 + uVar29;
            tccp->cblkw = OVar22;
            if (1 < parameters->cblockh_init) {
              OVar18 = 0;
              uVar23 = parameters->cblockh_init;
              do {
                OVar18 = OVar18 + 1;
                bVar30 = 3 < uVar23;
                uVar23 = uVar23 >> 1;
              } while (bVar30);
            }
            tccp->cblkh = OVar18;
            tccp->cblksty = parameters->mode;
            bVar30 = parameters->irreversible == 0;
            tccp->qmfbid = (uint)bVar30;
            tccp->qntsty = (uint)!bVar30 * 2;
            tccp->numgbits = 2;
            iVar9 = 0;
            if (uVar29 == (uint)parameters->roi_compno) {
              iVar9 = parameters->roi_shift;
            }
            tccp->roishift = iVar9;
            if (parameters->cp_cinema == OFF) {
              if (uVar15 == 0) {
                if (tccp->numresolutions != 0) {
                  uVar13 = 0;
                  do {
                    *(undefined4 *)((long)poVar12 + uVar13 * 4 + lVar21 + -0x84) = 0xf;
                    *(undefined4 *)((long)poVar12->stepsizes + uVar13 * 4 + lVar21 + -0x1c) = 0xf;
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < tccp->numresolutions);
                }
              }
              else if (-1 < (int)(uVar4 - 1)) {
                uVar13 = (ulong)(uVar4 - 1);
                uVar20 = 0;
                do {
                  lVar24 = (long)parameters->res_spec;
                  if ((long)uVar20 < lVar24) {
                    uVar15 = parameters->prcw_init[uVar20];
                    OVar18 = 1;
                    OVar22 = 1;
                    if ((0 < (int)uVar15) && (OVar22 = 0, uVar15 != 1)) {
                      OVar22 = 0;
                      do {
                        OVar22 = OVar22 + 1;
                        bVar30 = 3 < uVar15;
                        uVar15 = uVar15 >> 1;
                      } while (bVar30);
                    }
                    tccp->prcw[uVar13] = OVar22;
                    uVar15 = parameters->prch_init[uVar20];
                    if (0 < (int)uVar15) {
                      if (uVar15 == 1) {
LAB_001f1fce:
                        OVar18 = 0;
                      }
                      else {
                        OVar18 = 0;
                        do {
                          OVar18 = OVar18 + 1;
                          bVar30 = 3 < uVar15;
                          uVar15 = uVar15 >> 1;
                        } while (bVar30);
                      }
                    }
                  }
                  else {
                    bVar14 = ((char)uVar20 - (char)parameters->res_spec) + 1;
                    uVar15 = parameters->prcw_init[lVar24 + -1] >> (bVar14 & 0x1f);
                    uVar23 = parameters->prcw_init[lVar24 + 0x20] >> (bVar14 & 0x1f);
                    OVar18 = 1;
                    OVar22 = 1;
                    if ((0 < (int)uVar15) && (OVar22 = 0, uVar15 != 1)) {
                      OVar22 = 0;
                      do {
                        OVar22 = OVar22 + 1;
                        bVar30 = 3 < uVar15;
                        uVar15 = uVar15 >> 1;
                      } while (bVar30);
                    }
                    tccp->prcw[uVar13] = OVar22;
                    if (0 < (int)uVar23) {
                      if (uVar23 == 1) goto LAB_001f1fce;
                      OVar18 = 0;
                      do {
                        OVar18 = OVar18 + 1;
                        bVar30 = 3 < uVar23;
                        uVar23 = uVar23 >> 1;
                      } while (bVar30);
                    }
                  }
                  tccp->prch[uVar13] = OVar18;
                  uVar20 = uVar20 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar20 != uVar4);
              }
            }
            else {
              tccp->prcw[0] = 7;
              tccp->prch[0] = 7;
              if (1 < tccp->numresolutions) {
                lVar24 = 0xcc;
                do {
                  *(undefined4 *)((long)poVar12->stepsizes + lVar24 * 4 + lVar19 + -0x1c) = 8;
                  *(undefined4 *)((long)&poVar12->stepsizes[0xd].expn + lVar24 * 4 + lVar19) = 8;
                  uVar13 = lVar24 - 0xca;
                  lVar24 = lVar24 + 1;
                } while (uVar13 < tccp->numresolutions);
              }
            }
            dwt_calc_explicit_stepsizes(tccp,image->comps[uVar29].prec);
            uVar29 = uVar29 + 1;
            lVar19 = lVar19 + 0x438;
            lVar21 = lVar21 + 0x438;
          } while (uVar29 < image->numcomps);
        }
        uVar16 = uVar16 + 1;
        local_50 = local_50 + 0x15e8;
      } while ((long)uVar16 < (long)poVar10->th * (long)poVar10->tw);
    }
  }
  return;
}

Assistant:

void j2k_setup_encoder(opj_j2k_t *j2k, opj_cparameters_t *parameters, opj_image_t *image) {
	int i, j, tileno, numpocs_tile;
	opj_cp_t *cp = NULL;

	if(!j2k || !parameters || ! image) {
		return;
	}

	/* create and initialize the coding parameters structure */
	cp = (opj_cp_t*) opj_calloc(1, sizeof(opj_cp_t));

	/* keep a link to cp so that we can destroy it later in j2k_destroy_compress */
	j2k->cp = cp;

	/* set default values for cp */
	cp->tw = 1;
	cp->th = 1;

	/* 
	copy user encoding parameters 
	*/
	cp->cinema = parameters->cp_cinema;
	cp->max_comp_size =	parameters->max_comp_size;
	cp->rsiz   = parameters->cp_rsiz;
	cp->disto_alloc = parameters->cp_disto_alloc;
	cp->fixed_alloc = parameters->cp_fixed_alloc;
	cp->fixed_quality = parameters->cp_fixed_quality;

	/* mod fixed_quality */
	if(parameters->cp_matrice) {
		size_t array_size = parameters->tcp_numlayers * parameters->numresolution * 3 * sizeof(int);
		cp->matrice = (int *) opj_malloc(array_size);
		memcpy(cp->matrice, parameters->cp_matrice, array_size);
	}

	/* tiles */
	cp->tdx = parameters->cp_tdx;
	cp->tdy = parameters->cp_tdy;

	/* tile offset */
	cp->tx0 = parameters->cp_tx0;
	cp->ty0 = parameters->cp_ty0;

	/* comment string */
	if(parameters->cp_comment) {
		cp->comment = (char*)opj_malloc(strlen(parameters->cp_comment) + 1);
		if(cp->comment) {
			strcpy(cp->comment, parameters->cp_comment);
		}
	}

	/*
	calculate other encoding parameters
	*/

	if (parameters->tile_size_on) {
		cp->tw = int_ceildiv(image->x1 - cp->tx0, cp->tdx);
		cp->th = int_ceildiv(image->y1 - cp->ty0, cp->tdy);
	} else {
		cp->tdx = image->x1 - cp->tx0;
		cp->tdy = image->y1 - cp->ty0;
	}

	if(parameters->tp_on){
		cp->tp_flag = parameters->tp_flag;
		cp->tp_on = 1;
	}
	
	cp->img_size = 0;
	for(i=0;i<image->numcomps ;i++){
	cp->img_size += (image->comps[i].w *image->comps[i].h * image->comps[i].prec);
	}


#ifdef USE_JPWL
	/*
	calculate JPWL encoding parameters
	*/

	if (parameters->jpwl_epc_on) {
		int i;

		/* set JPWL on */
		cp->epc_on = OPJ_TRUE;
		cp->info_on = OPJ_FALSE; /* no informative technique */

		/* set EPB on */
		if ((parameters->jpwl_hprot_MH > 0) || (parameters->jpwl_hprot_TPH[0] > 0)) {
			cp->epb_on = OPJ_TRUE;
			
			cp->hprot_MH = parameters->jpwl_hprot_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->hprot_TPH_tileno[i] = parameters->jpwl_hprot_TPH_tileno[i];
				cp->hprot_TPH[i] = parameters->jpwl_hprot_TPH[i];
			}
			/* if tile specs are not specified, copy MH specs */
			if (cp->hprot_TPH[0] == -1) {
				cp->hprot_TPH_tileno[0] = 0;
				cp->hprot_TPH[0] = parameters->jpwl_hprot_MH;
			}
			for (i = 0; i < JPWL_MAX_NO_PACKSPECS; i++) {
				cp->pprot_tileno[i] = parameters->jpwl_pprot_tileno[i];
				cp->pprot_packno[i] = parameters->jpwl_pprot_packno[i];
				cp->pprot[i] = parameters->jpwl_pprot[i];
			}
		}

		/* set ESD writing */
		if ((parameters->jpwl_sens_size == 1) || (parameters->jpwl_sens_size == 2)) {
			cp->esd_on = OPJ_TRUE;

			cp->sens_size = parameters->jpwl_sens_size;
			cp->sens_addr = parameters->jpwl_sens_addr;
			cp->sens_range = parameters->jpwl_sens_range;

			cp->sens_MH = parameters->jpwl_sens_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->sens_TPH_tileno[i] = parameters->jpwl_sens_TPH_tileno[i];
				cp->sens_TPH[i] = parameters->jpwl_sens_TPH[i];
			}
		}

		/* always set RED writing to false: we are at the encoder */
		cp->red_on = OPJ_FALSE;

	} else {
		cp->epc_on = OPJ_FALSE;
	}
#endif /* USE_JPWL */


	/* initialize the mutiple tiles */
	/* ---------------------------- */
	cp->tcps = (opj_tcp_t*) opj_calloc(cp->tw * cp->th, sizeof(opj_tcp_t));

	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		opj_tcp_t *tcp = &cp->tcps[tileno];
		tcp->numlayers = parameters->tcp_numlayers;
		for (j = 0; j < tcp->numlayers; j++) {
			if(cp->cinema){
				if (cp->fixed_quality) {
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				}
				tcp->rates[j] = parameters->tcp_rates[j];
			}else{
				if (cp->fixed_quality) {	/* add fixed_quality */
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				} else {
					tcp->rates[j] = parameters->tcp_rates[j];
				}
			}
		}
		tcp->csty = parameters->csty;
		tcp->prg = parameters->prog_order;
		tcp->mct = parameters->tcp_mct; 

		numpocs_tile = 0;
		tcp->POC = 0;
		if (parameters->numpocs) {
			/* initialisation of POC */
			tcp->POC = 1;
			for (i = 0; i < parameters->numpocs; i++) {
				if((tileno == parameters->POC[i].tile - 1) || (parameters->POC[i].tile == -1)) {
					opj_poc_t *tcp_poc = &tcp->pocs[numpocs_tile];
					tcp_poc->resno0		= parameters->POC[numpocs_tile].resno0;
					tcp_poc->compno0	= parameters->POC[numpocs_tile].compno0;
					tcp_poc->layno1		= parameters->POC[numpocs_tile].layno1;
					tcp_poc->resno1		= parameters->POC[numpocs_tile].resno1;
					tcp_poc->compno1	= parameters->POC[numpocs_tile].compno1;
					tcp_poc->prg1		= parameters->POC[numpocs_tile].prg1;
					tcp_poc->tile		= parameters->POC[numpocs_tile].tile;
					numpocs_tile++;
				}
			}
			tcp->numpocs = numpocs_tile -1 ;
		}else{ 
			tcp->numpocs = 0;
		}

		tcp->tccps = (opj_tccp_t*) opj_calloc(image->numcomps, sizeof(opj_tccp_t));

		for (i = 0; i < image->numcomps; i++) {
			opj_tccp_t *tccp = &tcp->tccps[i];
			tccp->csty = parameters->csty & 0x01;	/* 0 => one precinct || 1 => custom precinct  */
			tccp->numresolutions = parameters->numresolution;
			tccp->cblkw = int_floorlog2(parameters->cblockw_init);
			tccp->cblkh = int_floorlog2(parameters->cblockh_init);
			tccp->cblksty = parameters->mode;
			tccp->qmfbid = parameters->irreversible ? 0 : 1;
			tccp->qntsty = parameters->irreversible ? J2K_CCP_QNTSTY_SEQNT : J2K_CCP_QNTSTY_NOQNT;
			tccp->numgbits = 2;
			if (i == parameters->roi_compno) {
				tccp->roishift = parameters->roi_shift;
			} else {
				tccp->roishift = 0;
			}

			if(parameters->cp_cinema)
			{
				/*Precinct size for lowest frequency subband=128*/
				tccp->prcw[0] = 7;
				tccp->prch[0] = 7;
				/*Precinct size at all other resolutions = 256*/
				for (j = 1; j < tccp->numresolutions; j++) {
					tccp->prcw[j] = 8;
					tccp->prch[j] = 8;
				}
			}else{
				if (parameters->csty & J2K_CCP_CSTY_PRT) {
					int p = 0;
					for (j = tccp->numresolutions - 1; j >= 0; j--) {
						if (p < parameters->res_spec) {
							
							if (parameters->prcw_init[p] < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(parameters->prcw_init[p]);
							}
							
							if (parameters->prch_init[p] < 1) {
								tccp->prch[j] = 1;
							}else {
								tccp->prch[j] = int_floorlog2(parameters->prch_init[p]);
							}

						} else {
							int res_spec = parameters->res_spec;
							int size_prcw = parameters->prcw_init[res_spec - 1] >> (p - (res_spec - 1));
							int size_prch = parameters->prch_init[res_spec - 1] >> (p - (res_spec - 1));
							
							if (size_prcw < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(size_prcw);
							}
							
							if (size_prch < 1) {
								tccp->prch[j] = 1;
							} else {
								tccp->prch[j] = int_floorlog2(size_prch);
							}
						}
						p++;
						/*printf("\nsize precinct for level %d : %d,%d\n", j,tccp->prcw[j], tccp->prch[j]); */
					}	/*end for*/
				} else {
					for (j = 0; j < tccp->numresolutions; j++) {
						tccp->prcw[j] = 15;
						tccp->prch[j] = 15;
					}
				}
			}

			dwt_calc_explicit_stepsizes(tccp, image->comps[i].prec);
		}
	}
}